

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

UCharsTrieBuilder * __thiscall
icu_63::UCharsTrieBuilder::add
          (UCharsTrieBuilder *this,UnicodeString *s,int32_t value,UErrorCode *errorCode)

{
  UErrorCode UVar1;
  int iVar2;
  UCharsTrieElement *__dest;
  UnicodeString *__src;
  UMemory *this_00;
  int iVar3;
  
  if (U_ZERO_ERROR < *errorCode) {
    return this;
  }
  UVar1 = U_NO_WRITE_PERMISSION;
  if (this->ucharsLength < 1) {
    iVar2 = this->elementsLength;
    if (iVar2 == this->elementsCapacity) {
      iVar3 = 0x400;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 4;
      }
      this_00 = (UMemory *)0xffffffffffffffff;
      if (-1 < iVar3) {
        this_00 = (UMemory *)((long)iVar3 * 8);
      }
      __src = s;
      __dest = (UCharsTrieElement *)UMemory::operator_new__(this_00,(size_t)s);
      if (__dest == (UCharsTrieElement *)0x0) {
        UVar1 = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_002a44a6;
      }
      if (0 < (long)this->elementsLength) {
        __src = (UnicodeString *)this->elements;
        memcpy(__dest,__src,(long)this->elementsLength << 3);
      }
      if (this->elements != (UCharsTrieElement *)0x0) {
        UMemory::operator_delete__((UMemory *)this->elements,__src);
      }
      this->elements = __dest;
      this->elementsCapacity = iVar3;
      iVar2 = this->elementsLength;
    }
    else {
      __dest = this->elements;
    }
    this->elementsLength = iVar2 + 1;
    UCharsTrieElement::setTo(__dest + iVar2,s,value,&this->strings,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return this;
    }
    UVar1 = U_MEMORY_ALLOCATION_ERROR;
    if ((undefined1  [56])((undefined1  [56])(this->strings).fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      return this;
    }
  }
LAB_002a44a6:
  *errorCode = UVar1;
  return this;
}

Assistant:

UCharsTrieBuilder &
UCharsTrieBuilder::add(const UnicodeString &s, int32_t value, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(ucharsLength>0) {
        // Cannot add elements after building.
        errorCode=U_NO_WRITE_PERMISSION;
        return *this;
    }
    if(elementsLength==elementsCapacity) {
        int32_t newCapacity;
        if(elementsCapacity==0) {
            newCapacity=1024;
        } else {
            newCapacity=4*elementsCapacity;
        }
        UCharsTrieElement *newElements=new UCharsTrieElement[newCapacity];
        if(newElements==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        if(elementsLength>0) {
            uprv_memcpy(newElements, elements, (size_t)elementsLength*sizeof(UCharsTrieElement));
        }
        delete[] elements;
        elements=newElements;
        elementsCapacity=newCapacity;
    }
    elements[elementsLength++].setTo(s, value, strings, errorCode);
    if(U_SUCCESS(errorCode) && strings.isBogus()) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}